

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.h
# Opt level: O2

TestResult *
JsonTest::checkEqual<long_long,float>
          (TestResult *result,longlong expected,float actual,char *file,uint line,char *expr)

{
  TestResult *pTVar1;
  float fVar2;
  float local_10;
  float local_c;
  
  fVar2 = (float)expected;
  if ((fVar2 != actual) || (NAN(fVar2) || NAN(actual))) {
    local_10 = actual;
    TestResult::addFailure(result,file,line,expr);
    pTVar1 = TestResult::operator<<(result,(char (*) [11])"Expected: ");
    local_c = fVar2;
    pTVar1 = TestResult::operator<<(pTVar1,&local_c);
    TestResult::operator<<(pTVar1,(char (*) [2])0x14914f);
    pTVar1 = TestResult::operator<<(result,(char (*) [11])"Actual  : ");
    TestResult::operator<<(pTVar1,&local_10);
  }
  return result;
}

Assistant:

TestResult& checkEqual(TestResult& result,
                       T expected,
                       U actual,
                       const char* file,
                       unsigned int line,
                       const char* expr) {
  if (static_cast<U>(expected) != actual) {
    result.addFailure(file, line, expr);
    result << "Expected: " << static_cast<U>(expected) << "\n";
    result << "Actual  : " << actual;
  }
  return result;
}